

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O1

shared_ptr<polyscope::render::TextureBuffer> __thiscall
polyscope::render::backend_openGL_mock::MockGLEngine::generateTextureBuffer
          (MockGLEngine *this,TextureFormat format,uint sizeX_,uint sizeY_,float *data)

{
  GLTextureBuffer *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float *in_R9;
  shared_ptr<polyscope::render::TextureBuffer> sVar1;
  
  this_00 = (GLTextureBuffer *)operator_new(0x18);
  GLTextureBuffer::GLTextureBuffer(this_00,sizeX_,sizeY_,(uint)data,in_R9);
  (this->super_Engine)._vptr_Engine = (_func_int **)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<polyscope::render::backend_openGL_mock::GLTextureBuffer*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_Engine).groundPlane,this_00
            );
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<polyscope::render::TextureBuffer>)
         sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextureBuffer> MockGLEngine::generateTextureBuffer(TextureFormat format, unsigned int sizeX_,
                                                                   unsigned int sizeY_, float* data) {
  GLTextureBuffer* newT = new GLTextureBuffer(format, sizeX_, sizeY_, data);
  return std::shared_ptr<TextureBuffer>(newT);
}